

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assigner.hpp
# Opt level: O3

void __thiscall
diy::DynamicAssigner::DynamicAssigner
          (DynamicAssigner *this,communicator *comm,int size__,int nblocks__)

{
  undefined4 uVar1;
  MPI_Comm poVar2;
  undefined4 uVar3;
  int iVar4;
  DIY_MPI_Win win;
  DIY_MPI_Win local_20;
  
  (this->super_Assigner).size_ = size__;
  (this->super_Assigner).nblocks_ = nblocks__;
  (this->super_Assigner)._vptr_Assigner = (_func_int **)&PTR__DynamicAssigner_001ca7c8;
  poVar2 = (comm->comm_).data;
  (this->comm_).comm_.data = poVar2;
  uVar1 = comm->rank_;
  uVar3 = comm->size_;
  (this->comm_).rank_ = uVar1;
  (this->comm_).size_ = uVar3;
  (this->comm_).owner_ = false;
  iVar4 = (nblocks__ / size__ + 1) - (uint)(nblocks__ % size__ == 0);
  this->div_ = iVar4;
  (this->rank_map_).buffer_ = (void *)0x0;
  (this->rank_map_).rank_ = uVar1;
  MPI_Win_allocate(iVar4 * 4,4,&ompi_mpi_info_null,poVar2,&this->rank_map_,&local_20);
  (this->rank_map_).window_.data = local_20.data;
  MPI_Win_lock_all(1);
  return;
}

Assistant:

DynamicAssigner(const mpi::communicator& comm, int size__, int nblocks__):
                      Assigner(size__, nblocks__),
                      comm_(comm),
                      div_(nblocks__ / size__ + ((nblocks__ % size__) == 0 ? 0 : 1)),   // NB: same size window everywhere means the last rank may allocate extra space
                      rank_map_(comm_, div_)                                            { rank_map_.lock_all(mpi::nocheck); }